

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest::ReadStuff
          (IoTest *this,ZeroCopyInputStream *input,bool read_eof)

{
  int iVar1;
  undefined4 extraout_var;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *lhs;
  string *str;
  string *str_00;
  string *str_01;
  string *str_02;
  string *str_03;
  string *str_04;
  string *str_05;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  uint8_t byte;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  AssertHelper local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  ZeroCopyInputStream local_28;
  
  local_60 = (undefined1  [8])&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Hello world!\n","");
  ReadString(this,(ZeroCopyInputStream *)local_60,str);
  if (local_60 != (undefined1  [8])&local_50) {
    operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
  }
  local_60 = (undefined1  [8])&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Some text.  ","");
  ReadString(this,(ZeroCopyInputStream *)local_60,str_00);
  if (local_60 != (undefined1  [8])&local_50) {
    operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
  }
  local_60 = (undefined1  [8])&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Blah ","");
  ReadString(this,(ZeroCopyInputStream *)local_60,str_01);
  if (local_60 != (undefined1  [8])&local_50) {
    operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
  }
  local_60 = (undefined1  [8])&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"blah.","");
  ReadString(this,(ZeroCopyInputStream *)local_60,str_02);
  if (local_60 != (undefined1  [8])&local_50) {
    operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
  }
  local_60 = (undefined1  [8])&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"abcdefg","");
  ReadString(this,(ZeroCopyInputStream *)local_60,str_03);
  if (local_60 != (undefined1  [8])&local_50) {
    operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
  }
  iVar1 = (*(this->super_Test)._vptr_Test[4])(this,0x14);
  local_38._M_head_impl._0_1_ = (char)iVar1;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((char)iVar1 == '\0') {
    testing::Message::Message((Message *)&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_38,(AssertionResult *)"input->Skip(20)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0xe7,(char *)local_60);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_28,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
    if (local_60 != (undefined1  [8])&local_50) {
      operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_40.data_._4_4_,local_40.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_40.data_._4_4_,local_40.data_._0_4_) + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  local_60 = (undefined1  [8])&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"foo","");
  ReadString(this,(ZeroCopyInputStream *)local_60,str_04);
  if (local_60 != (undefined1  [8])&local_50) {
    operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
  }
  local_60 = (undefined1  [8])&local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"bar","");
  ReadString(this,(ZeroCopyInputStream *)local_60,str_05);
  if (local_60 != (undefined1  [8])&local_50) {
    operator_delete((void *)local_60,local_50._M_allocated_capacity + 1);
  }
  iVar1 = (*(this->super_Test)._vptr_Test[5])(this);
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(extraout_var,iVar1);
  lhs = &local_38;
  local_40.data_._0_4_ = 0x44;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_60,"input->ByteCount()","68",(long *)lhs,(int *)&local_40);
  iVar1 = (int)lhs;
  if (local_60[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar2 = (local_58->_M_dataplus)._M_p;
    }
    iVar1 = 0xeb;
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  if ((char)input != '\0') {
    iVar1 = ReadFromInput(this,&local_28,(void *)0x1,iVar1);
    local_38._M_head_impl._0_4_ = iVar1;
    local_40.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_60,"ReadFromInput(input, &byte, 1)","0",(int *)&local_38,
               (int *)&local_40);
    if (local_60[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar2 = (local_58->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0xef,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  return;
}

Assistant:

void IoTest::ReadStuff(ZeroCopyInputStream* input, bool read_eof) {
  ReadString(input, "Hello world!\n");
  ReadString(input, "Some text.  ");
  ReadString(input, "Blah ");
  ReadString(input, "blah.");
  ReadString(input, "abcdefg");
  EXPECT_TRUE(input->Skip(20));
  ReadString(input, "foo");
  ReadString(input, "bar");

  EXPECT_EQ(input->ByteCount(), 68);

  if (read_eof) {
    uint8_t byte;
    EXPECT_EQ(ReadFromInput(input, &byte, 1), 0);
  }
}